

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem_utils.cpp
# Opt level: O0

bool FileSysUtilsGetCanonicalPath(string *path,string *canonical)

{
  char *pcVar1;
  char local_1028 [8];
  char buf [4096];
  string *canonical_local;
  string *path_local;
  
  pcVar1 = (char *)std::__cxx11::string::c_str();
  pcVar1 = realpath(pcVar1,local_1028);
  if (pcVar1 != (char *)0x0) {
    std::__cxx11::string::operator=((string *)canonical,local_1028);
  }
  return pcVar1 != (char *)0x0;
}

Assistant:

bool FileSysUtilsGetCanonicalPath(const std::string& path, std::string& canonical) {
    char buf[PATH_MAX];
    if (nullptr != realpath(path.c_str(), buf)) {
        canonical = buf;
        return true;
    }
    return false;
}